

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

Reg __thiscall backend::codegen::RegAllocator::get_collapse_reg(RegAllocator *this,Reg r)

{
  bool bVar1;
  iterator iVar2;
  Reg in_ESI;
  iterator rd;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  Reg r_00;
  undefined4 in_stack_ffffffffffffffe8;
  Reg local_4;
  
  iVar2 = std::
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::find(in_stack_ffffffffffffffc8,(key_type *)0x245308);
  r_00 = iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
         _4_4_;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                     &stack0xffffffffffffffe0,&local_28);
  local_4 = in_ESI;
  if (!bVar1) {
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *)0x24534c
              );
    local_4 = get_collapse_reg((RegAllocator *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),r_00);
  }
  return local_4;
}

Assistant:

Reg get_collapse_reg(Reg r) {
    auto rd = reg_collapse.find(r);
    if (rd == reg_collapse.end())
      return r;
    else
      return get_collapse_reg(rd->second);
  }